

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Client.cpp
# Opt level: O2

void __thiscall xmrig::Client::deleteLater(Client *this)

{
  int iVar1;
  
  if ((this->super_BaseClient).m_listener != (IClientListener *)0x0) {
    (this->super_BaseClient).m_listener = (IClientListener *)0x0;
    iVar1 = (*(this->super_BaseClient).super_IClient._vptr_IClient[2])();
    if ((char)iVar1 == '\0') {
      Storage<xmrig::Client>::remove((Storage<xmrig::Client> *)m_storage,(char *)this->m_key);
      return;
    }
  }
  return;
}

Assistant:

void xmrig::Client::deleteLater()
{
    if (!m_listener) {
        return;
    }

    m_listener = nullptr;

    if (!disconnect()) {
        m_storage.remove(m_key);
    }
}